

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void libcellml::clearComponentImports(ComponentPtr *component)

{
  ulong uVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *this;
  size_t sVar4;
  ComponentEntity local_48;
  ulong local_38;
  size_t c;
  ImportedEntity local_20;
  __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_10;
  ComponentPtr *component_local;
  
  local_10 = (__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             component;
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
  bVar2 = ImportedEntity::isImport(&peVar3->super_ImportedEntity);
  if (bVar2) {
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->(local_10);
    ImportedEntity::importSource(&local_20);
    this = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_20);
    ImportSource::removeModel(this);
    std::shared_ptr<libcellml::ImportSource>::~shared_ptr
              ((shared_ptr<libcellml::ImportSource> *)&local_20);
  }
  local_38 = 0;
  while( true ) {
    uVar1 = local_38;
    peVar3 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_10);
    sVar4 = ComponentEntity::componentCount(&peVar3->super_ComponentEntity);
    if (sVar4 <= uVar1) break;
    peVar3 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_10);
    ComponentEntity::component(&local_48,(size_t)peVar3);
    clearComponentImports((ComponentPtr *)&local_48);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)&local_48);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void clearComponentImports(const ComponentPtr &component)
{
    if (component->isImport()) {
        component->importSource()->removeModel();
    }
    for (size_t c = 0; c < component->componentCount(); ++c) {
        clearComponentImports(component->component(c));
    }
}